

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O3

DefinitionSymbol * __thiscall slang::ast::Symbol::getDeclaringDefinition(Symbol *this)

{
  SymbolKind SVar1;
  
  SVar1 = this->kind;
  while( true ) {
    if (SVar1 == InstanceBody) {
      return (DefinitionSymbol *)this[2].name._M_str;
    }
    if (this->parentScope == (Scope *)0x0) break;
    this = this->parentScope->thisSym;
    SVar1 = this->kind;
  }
  return (DefinitionSymbol *)0x0;
}

Assistant:

const DefinitionSymbol* Symbol::getDeclaringDefinition() const {
    auto curr = this;
    while (curr->kind != SymbolKind::InstanceBody) {
        auto scope = curr->getParentScope();
        if (!scope)
            return nullptr;

        curr = &scope->asSymbol();
    }

    return &curr->as<InstanceBodySymbol>().getDefinition();
}